

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::IsActiveScriptPubKeyMan(CWallet *this,ScriptPubKeyMan *spkm)

{
  long lVar1;
  bool bVar2;
  type *ppSVar3;
  type in_RSI;
  _Self *in_RDI;
  long in_FS_OFFSET;
  type *int_spkm;
  type *__1;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *__range1_1;
  type *ext_spkm;
  type *_;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  pair<const_OutputType,_wallet::ScriptPubKeyMan_*> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  ::begin((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
           *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  std::
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  ::end((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
         *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  while( true ) {
    bVar2 = std::operator==(in_RDI,(_Self *)CONCAT17(in_stack_ffffffffffffff77,
                                                     in_stack_ffffffffffffff70));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_> *)
               in_stack_ffffffffffffff68);
    std::get<0ul,OutputType_const,wallet::ScriptPubKeyMan*>(in_stack_ffffffffffffff68);
    ppSVar3 = std::get<1ul,OutputType_const,wallet::ScriptPubKeyMan*>(in_stack_ffffffffffffff68);
    if (*ppSVar3 == in_RSI) {
      local_29 = true;
      goto LAB_00aec071;
    }
    std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_> *)
               in_stack_ffffffffffffff68);
  }
  std::
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  ::begin((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
           *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  std::
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  ::end((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
         *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  do {
    bVar2 = std::operator==(in_RDI,(_Self *)CONCAT17(in_stack_ffffffffffffff77,
                                                     in_stack_ffffffffffffff70));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_29 = false;
LAB_00aec071:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_29;
      }
      __stack_chk_fail();
    }
    std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_> *)
               in_stack_ffffffffffffff68);
    std::get<0ul,OutputType_const,wallet::ScriptPubKeyMan*>(in_stack_ffffffffffffff68);
    ppSVar3 = std::get<1ul,OutputType_const,wallet::ScriptPubKeyMan*>(in_stack_ffffffffffffff68);
    if (*ppSVar3 == in_RSI) {
      local_29 = true;
      goto LAB_00aec071;
    }
    std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_> *)
               in_stack_ffffffffffffff68);
  } while( true );
}

Assistant:

bool CWallet::IsActiveScriptPubKeyMan(const ScriptPubKeyMan& spkm) const
{
    for (const auto& [_, ext_spkm] : m_external_spk_managers) {
        if (ext_spkm == &spkm) return true;
    }
    for (const auto& [_, int_spkm] : m_internal_spk_managers) {
        if (int_spkm == &spkm) return true;
    }
    return false;
}